

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infoPageAnalyzer.cpp
# Opt level: O3

string * __thiscall
infoPageAnalyzer::getGidInString_abi_cxx11_(string *__return_storage_ptr__,infoPageAnalyzer *this)

{
  char *__end;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"?gid=","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"?gid=","");
  pageAnalyzer::getInfoFromContent
            (__return_storage_ptr__,&this->super_pageAnalyzer,&local_50,0,0x12,&local_70,'&');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string infoPageAnalyzer::getGidInString() {
    return this->getInfoFromContent(std::string("?gid="), 0, GETMODE_PART, std::string("?gid="), '&');
}